

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# player.cpp
# Opt level: O2

void __thiscall CPlayer::OnDirectInput(CPlayer *this,CNetObj_PlayerInput *NewInput)

{
  uint uVar1;
  CCharacter *pCVar2;
  CEntity *pCVar3;
  CFlag *pCVar4;
  int iVar5;
  int iVar6;
  float fVar7;
  float fVar8;
  
  uVar1 = NewInput->m_PlayerFlags;
  if ((this->m_pGameServer->m_World).m_Paused == true) {
LAB_0011d2fe:
    this->m_PlayerFlags = uVar1;
    return;
  }
  if ((uVar1 & 2) != 0) {
    if ((this->m_PlayerFlags & 2) != 0) {
      return;
    }
    if (this->m_pCharacter != (CCharacter *)0x0) {
      CCharacter::ResetInput(this->m_pCharacter);
      uVar1 = NewInput->m_PlayerFlags;
    }
    goto LAB_0011d2fe;
  }
  this->m_PlayerFlags = uVar1;
  if (this->m_pCharacter == (CCharacter *)0x0) {
    pCVar2 = (CCharacter *)0x0;
  }
  else {
    CCharacter::OnDirectInput(this->m_pCharacter,NewInput);
    pCVar2 = this->m_pCharacter;
  }
  iVar5 = this->m_Team;
  if (iVar5 == -1 || pCVar2 != (CCharacter *)0x0) {
LAB_0011d384:
    if (((pCVar2 == (CCharacter *)0x0) && (iVar5 == -1)) && ((NewInput->m_Fire & 1) != 0)) {
      if (this->m_ActiveSpecSwitch != false) goto LAB_0011d3a5;
      this->m_ActiveSpecSwitch = true;
      if (this->m_SpecMode != 0) {
        this->m_SpecMode = 0;
        this->m_SpectatorID = -1;
        this->m_pSpecFlag = (CFlag *)0x0;
        goto LAB_0011d3a5;
      }
      pCVar3 = CGameWorld::ClosestEntity
                         (&this->m_pGameServer->m_World,this->m_ViewPos,192.0,3,(CEntity *)0x0);
      pCVar4 = (CFlag *)CGameWorld::ClosestEntity
                                  (&this->m_pGameServer->m_World,this->m_ViewPos,192.0,4,
                                   (CEntity *)0x0);
      if (pCVar3 == (CEntity *)0x0 && pCVar4 == (CFlag *)0x0) goto LAB_0011d3a5;
      if (pCVar3 == (CEntity *)0x0) {
LAB_0011d4dc:
        this->m_SpecMode = 3 - (uint)(pCVar4->m_Team == 0);
        this->m_pSpecFlag = pCVar4;
        this->m_SpectatorID = -1;
      }
      else {
        if (pCVar4 != (CFlag *)0x0) {
          fVar7 = distance<float>(&this->m_ViewPos,&(pCVar4->super_CEntity).m_Pos);
          fVar8 = distance<float>(&this->m_ViewPos,&pCVar3->m_Pos);
          if (fVar7 < fVar8) goto LAB_0011d4dc;
        }
        this->m_SpecMode = 1;
        this->m_pSpecFlag = (CFlag *)0x0;
        this->m_SpectatorID = *(int *)((long)pCVar3[1]._vptr_CEntity + 0x404);
      }
      goto LAB_0011d3a5;
    }
  }
  else if ((NewInput->m_Fire & 1) != 0) {
    Respawn(this);
    pCVar2 = this->m_pCharacter;
    iVar5 = this->m_Team;
    goto LAB_0011d384;
  }
  if (this->m_ActiveSpecSwitch == true) {
    this->m_ActiveSpecSwitch = false;
  }
LAB_0011d3a5:
  if (NewInput->m_Direction == 0) {
    iVar5 = (this->m_LatestActivity).m_TargetX;
    iVar6 = NewInput->m_TargetX;
    if (((iVar5 == NewInput->m_TargetX) &&
        (iVar6 = iVar5, (this->m_LatestActivity).m_TargetY == NewInput->m_TargetY)) &&
       ((NewInput->m_Jump == 0 && (((NewInput->m_Fire & 1) == 0 && (NewInput->m_Hook == 0)))))) {
      return;
    }
  }
  else {
    iVar6 = NewInput->m_TargetX;
  }
  (this->m_LatestActivity).m_TargetX = iVar6;
  (this->m_LatestActivity).m_TargetY = NewInput->m_TargetY;
  this->m_LastActionTick = this->m_pGameServer->m_pServer->m_CurrentGameTick;
  this->m_InactivityTickCounter = 0;
  return;
}

Assistant:

void CPlayer::OnDirectInput(CNetObj_PlayerInput *NewInput)
{
	if(GameServer()->m_World.m_Paused)
	{
		m_PlayerFlags = NewInput->m_PlayerFlags;
		return;
	}

	if(NewInput->m_PlayerFlags&PLAYERFLAG_CHATTING)
	{
		// skip the input if chat is active
		if(m_PlayerFlags&PLAYERFLAG_CHATTING)
			return;

		// reset input
		if(m_pCharacter)
			m_pCharacter->ResetInput();

		m_PlayerFlags = NewInput->m_PlayerFlags;
		return;
	}

	m_PlayerFlags = NewInput->m_PlayerFlags;

	if(m_pCharacter)
		m_pCharacter->OnDirectInput(NewInput);

	if(!m_pCharacter && m_Team != TEAM_SPECTATORS && (NewInput->m_Fire&1))
		Respawn();

	if(!m_pCharacter && m_Team == TEAM_SPECTATORS && (NewInput->m_Fire&1))
	{
		if(!m_ActiveSpecSwitch)
		{
			m_ActiveSpecSwitch = true;
			if(m_SpecMode == SPEC_FREEVIEW)
			{
				CCharacter *pChar = (CCharacter *)GameServer()->m_World.ClosestEntity(m_ViewPos, 6.0f*32, CGameWorld::ENTTYPE_CHARACTER, 0);
				CFlag *pFlag = (CFlag *)GameServer()->m_World.ClosestEntity(m_ViewPos, 6.0f*32, CGameWorld::ENTTYPE_FLAG, 0);
				if(pChar || pFlag)
				{
					if(!pChar || (pFlag && pChar && distance(m_ViewPos, pFlag->GetPos()) < distance(m_ViewPos, pChar->GetPos())))
					{
						m_SpecMode = pFlag->GetTeam() == TEAM_RED ? SPEC_FLAGRED : SPEC_FLAGBLUE;
						m_pSpecFlag = pFlag;
						m_SpectatorID = -1;
					}
					else
					{
						m_SpecMode = SPEC_PLAYER;
						m_pSpecFlag = 0;
						m_SpectatorID = pChar->GetPlayer()->GetCID();
					}
				}
			}
			else
			{
				m_SpecMode = SPEC_FREEVIEW;
				m_pSpecFlag = 0;
				m_SpectatorID = -1;
			}
		}
	}
	else if(m_ActiveSpecSwitch)
		m_ActiveSpecSwitch = false;

	// check for activity
	if(NewInput->m_Direction || m_LatestActivity.m_TargetX != NewInput->m_TargetX ||
		m_LatestActivity.m_TargetY != NewInput->m_TargetY || NewInput->m_Jump ||
		NewInput->m_Fire&1 || NewInput->m_Hook)
	{
		m_LatestActivity.m_TargetX = NewInput->m_TargetX;
		m_LatestActivity.m_TargetY = NewInput->m_TargetY;
		m_LastActionTick = Server()->Tick();
		m_InactivityTickCounter = 0;
	}
}